

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderQuadsDegenerateCase::iterate(TessellationShaderQuadsDegenerateCase *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  pointer value;
  float *vertex_data;
  bool bVar3;
  long lVar4;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  NotSupportedError *this_00;
  pointer p_Var7;
  _tessellation_shader_vertex_spacing vertex_spacing;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  pointer p_Var8;
  ulong uVar9;
  float *triangle_vertex_data;
  long lVar10;
  string vs_mode_string;
  string ref_vs_mode_string;
  undefined1 local_1b0 [384];
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&vs_mode_string);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  value = (this->m_runs).
          super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
          ._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = (this->m_runs).
           super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  lVar10 = 0;
  while( true ) {
    p_Var8 = (pointer)((long)value->inner + lVar4);
    if (p_Var8 == p_Var7) {
      uVar9 = 0;
      do {
        if ((ulong)value->n_vertices / 3 <= uVar9) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          return STOP;
        }
        triangle_vertex_data =
             (float *)((ulong)(uint)((int)uVar9 * 9) * 4 +
                      *(long *)&(value->data).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data);
        p_Var8 = (this->m_runs).
                 super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (p_Var8 + 1 != p_Var7) {
          vertex_data = (float *)p_Var8[1].data.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
          bVar3 = TessellationShaderUtils::isTriangleDefined(triangle_vertex_data,vertex_data);
          if (!bVar3) {
            bVar3 = TessellationShaderUtils::isTriangleDefined(triangle_vertex_data,vertex_data + 9)
            ;
            if (!bVar3) {
              TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                        (&vs_mode_string,(TessellationShaderUtils *)(ulong)value->vertex_spacing,
                         vertex_spacing_00);
              TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                        (&ref_vs_mode_string,
                         (TessellationShaderUtils *)(ulong)p_Var8[1].vertex_spacing,
                         vertex_spacing_01);
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar2 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,
                              "Reference run does not contain a triangle found in a base run generated for the following tessellation configuration: primitive mode:quads, base vertex spacing mode:"
                             );
              std::operator<<((ostream *)poVar2,(string *)&vs_mode_string);
              std::operator<<((ostream *)poVar2," base inner tessellation levels:");
              pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value->inner);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value->inner + 1);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              " base outer tessellation levels:");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value->outer);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value->outer + 1);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value->outer + 2);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,value->outer + 3);
              poVar1 = &pMVar5->m_str;
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              "reference vertex spacing mode:");
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              (string *)&ref_vs_mode_string);
              std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                              " reference inner tessellation levels:");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].inner);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].inner + 1);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              " reference outer tessellation levels:");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].outer);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].outer + 1);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].outer + 2);
              std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              ", ");
              pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,p_Var8[1].outer + 3);
              tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,"Reference run does not contain a triangle found in a base run",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                         ,299);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          p_Var8 = p_Var8 + 1;
          p_Var7 = (this->m_runs).
                   super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar9 = uVar9 + 1;
      } while( true );
    }
    if (*(int *)((long)value->outer + lVar4 + 0x30) != 6) break;
    lVar10 = lVar10 + -0x40;
    lVar4 = lVar4 + 0x40;
  }
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            (&vs_mode_string,
             (TessellationShaderUtils *)(ulong)*(uint *)((long)value->outer + lVar4 + 0x10),
             vertex_spacing);
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Invalid number of coordinates (");
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(uint *)((long)value + (0x38 - lVar10)));
  poVar1 = &pMVar5->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  ", instead of 6) was generated for the following tessellation configuration: primitive mode:quads, vertex spacing mode:"
                 );
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  (string *)&vs_mode_string);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  " inner tessellation levels:");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)p_Var8);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)value + (4 - lVar10)));
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " outer tessellation levels:");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)value + (8 - lVar10)));
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)value + (0xc - lVar10)));
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)value + (0x10 - lVar10)));
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)((long)value + (0x14 - lVar10)));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Invalid number of coordinates was generated for at least one run",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
             ,0xf9);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderQuadsDegenerateCase::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize the test */
	initTest();

	/* Iterate through all runs */

	/* The test fails if any of the runs did not generate exactly 6 coordinates */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		if (run.n_vertices != (2 /* triangles */ * 3 /* vertices */))
		{
			std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of coordinates (" << run.n_vertices
							   << ", instead of 6)"
								  " was generated for the following tessellation configuration: "
								  "primitive mode:quads, "
								  "vertex spacing mode:"
							   << vs_mode_string << " inner tessellation levels:" << run.inner[0] << ", "
							   << run.inner[1] << " outer tessellation levels:" << run.outer[0] << ", " << run.outer[1]
							   << ", " << run.outer[2] << ", " << run.outer[3] << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid number of coordinates was generated for at least one run");
		}
	} /* for (all runs) */

	/* All runs should generate exactly the same set of triangles.
	 *
	 * Note: we must not assume any specific vertex ordering, so we cannot
	 *       just do a plain memcmp() here.
	 */
	const _run& base_run = *m_runs.begin();

	for (unsigned int n_triangle = 0; n_triangle < base_run.n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* base_triangle_data = (const float*)(&base_run.data[0]) +
										  3		  /* vertices per triangle */
											  * 3 /* components */
											  * n_triangle;

		for (_runs_const_iterator ref_run_iterator = m_runs.begin() + 1; ref_run_iterator != m_runs.end();
			 ref_run_iterator++)
		{
			const _run& ref_run = *ref_run_iterator;

			const float* ref_triangle_data1 = (const float*)(&ref_run.data[0]);
			const float* ref_triangle_data2 =
				(const float*)(&ref_run.data[0]) + 3 /* vertices per triangle */ * 3 /* components */;

			if (!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data1) &&
				!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data2))
			{
				std::string base_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(base_run.vertex_spacing);
				std::string ref_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(ref_run.vertex_spacing);

				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Reference run does not contain a triangle found in a base run"
									  " generated for the following tessellation configuration: "
									  "primitive mode:quads, "
									  "base vertex spacing mode:"
								   << base_vs_mode_string << " base inner tessellation levels:" << base_run.inner[0]
								   << ", " << base_run.inner[1]
								   << " base outer tessellation levels:" << base_run.outer[0] << ", "
								   << base_run.outer[1] << ", " << base_run.outer[2] << ", " << base_run.outer[3]
								   << "reference vertex spacing mode:" << ref_vs_mode_string
								   << " reference inner tessellation levels:" << ref_run.inner[0] << ", "
								   << ref_run.inner[1] << " reference outer tessellation levels:" << ref_run.outer[0]
								   << ", " << ref_run.outer[1] << ", " << ref_run.outer[2] << ", " << ref_run.outer[3]
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Reference run does not contain a triangle found in a base run");
			}
		} /* for (all reference runs) */
	}	 /* for (all triangles) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}